

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_0::bitmapFromData
               (unsigned_short *data,int nData,uchar *bitmap,unsigned_short *minNonZero,
               unsigned_short *maxNonZero)

{
  int i_2;
  int i_1;
  int i;
  unsigned_short *maxNonZero_local;
  unsigned_short *minNonZero_local;
  uchar *bitmap_local;
  int nData_local;
  unsigned_short *data_local;
  
  for (i = 0; i < 0x2000; i = i + 1) {
    bitmap[i] = '\0';
  }
  for (i_1 = 0; i_1 < nData; i_1 = i_1 + 1) {
    bitmap[(int)(uint)data[i_1] >> 3] =
         bitmap[(int)(uint)data[i_1] >> 3] | (byte)(1 << ((byte)data[i_1] & 7));
  }
  *bitmap = *bitmap & 0xfe;
  *minNonZero = 0x1fff;
  *maxNonZero = 0;
  for (i_2 = 0; i_2 < 0x2000; i_2 = i_2 + 1) {
    if (bitmap[i_2] != '\0') {
      if (i_2 < (int)(uint)*minNonZero) {
        *minNonZero = (unsigned_short)i_2;
      }
      if ((int)(uint)*maxNonZero < i_2) {
        *maxNonZero = (unsigned_short)i_2;
      }
    }
  }
  return;
}

Assistant:

void
bitmapFromData (const unsigned short data[/*nData*/],
		int nData,
		unsigned char bitmap[BITMAP_SIZE],
		unsigned short &minNonZero,
		unsigned short &maxNonZero)
{
    for (int i = 0; i < BITMAP_SIZE; ++i)
	bitmap[i] = 0;

    for (int i = 0; i < nData; ++i)
	bitmap[data[i] >> 3] |= (1 << (data[i] & 7));

    bitmap[0] &= ~1;			// zero is not explicitly stored in
					// the bitmap; we assume that the
					// data always contain zeroes
    minNonZero = BITMAP_SIZE - 1;
    maxNonZero = 0;

    for (int i = 0; i < BITMAP_SIZE; ++i)
    {
	if (bitmap[i])
	{
	    if (minNonZero > i)
		minNonZero = i;
	    if (maxNonZero < i)
		maxNonZero = i;
	}
    }
}